

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

_Bool multi_handle_timeout
                (Curl_easy *data,curltime *now,_Bool *stream_error,CURLcode *result,
                _Bool connect_timeout)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  timediff_t tVar9;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime newer_02;
  curltime older;
  curltime older_00;
  curltime older_01;
  curltime older_02;
  SingleRequest *k;
  curltime since;
  timediff_t timeout_ms;
  _Bool connect_timeout_local;
  CURLcode *result_local;
  _Bool *stream_error_local;
  curltime *now_local;
  Curl_easy *data_local;
  
  tVar9 = Curl_timeleft(data,now,connect_timeout);
  if (tVar9 < 0) {
    if (connect_timeout) {
      k = (SingleRequest *)(data->progress).t_startsingle.tv_sec;
      since.tv_sec._0_4_ = (undefined4)*(undefined8 *)&(data->progress).t_startsingle.tv_usec;
    }
    else {
      k = (SingleRequest *)(data->progress).t_startop.tv_sec;
      since.tv_sec._0_4_ = (undefined4)*(undefined8 *)&(data->progress).t_startop.tv_usec;
    }
    if (data->mstate == MSTATE_RESOLVING) {
      uVar1 = now->tv_sec;
      uVar2 = now->tv_usec;
      newer.tv_usec = uVar2;
      newer.tv_sec = uVar1;
      older.tv_usec = (undefined4)since.tv_sec;
      older.tv_sec = (time_t)k;
      newer._12_4_ = 0;
      older._12_4_ = 0;
      tVar9 = Curl_timediff(newer,older);
      Curl_failf(data,"Resolving timed out after %ld milliseconds",tVar9);
    }
    else if (data->mstate == MSTATE_CONNECTING) {
      uVar3 = now->tv_sec;
      uVar4 = now->tv_usec;
      newer_00.tv_usec = uVar4;
      newer_00.tv_sec = uVar3;
      older_00.tv_usec = (undefined4)since.tv_sec;
      older_00.tv_sec = (time_t)k;
      newer_00._12_4_ = 0;
      older_00._12_4_ = 0;
      tVar9 = Curl_timediff(newer_00,older_00);
      Curl_failf(data,"Connection timed out after %ld milliseconds",tVar9);
    }
    else if ((data->req).size == -1) {
      uVar7 = now->tv_sec;
      uVar8 = now->tv_usec;
      newer_02.tv_usec = uVar8;
      newer_02.tv_sec = uVar7;
      older_02.tv_usec = (undefined4)since.tv_sec;
      older_02.tv_sec = (time_t)k;
      newer_02._12_4_ = 0;
      older_02._12_4_ = 0;
      tVar9 = Curl_timediff(newer_02,older_02);
      Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",tVar9,
                 (data->req).bytecount);
    }
    else {
      uVar5 = now->tv_sec;
      uVar6 = now->tv_usec;
      newer_01.tv_usec = uVar6;
      newer_01.tv_sec = uVar5;
      older_01.tv_usec = (undefined4)since.tv_sec;
      older_01.tv_sec = (time_t)k;
      newer_01._12_4_ = 0;
      older_01._12_4_ = 0;
      tVar9 = Curl_timediff(newer_01,older_01);
      Curl_failf(data,
                 "Operation timed out after %ld milliseconds with %ld out of %ld bytes received",
                 tVar9,(data->req).bytecount,(data->req).size);
    }
    *result = CURLE_OPERATION_TIMEDOUT;
    if (data->conn != (connectdata *)0x0) {
      if (MSTATE_DO < data->mstate) {
        Curl_conncontrol(data->conn,2);
        *stream_error = true;
      }
      multi_done(data,*result,true);
    }
    data_local._7_1_ = true;
  }
  else {
    data_local._7_1_ = false;
  }
  return data_local._7_1_;
}

Assistant:

static bool multi_handle_timeout(struct Curl_easy *data,
                                 struct curltime *now,
                                 bool *stream_error,
                                 CURLcode *result,
                                 bool connect_timeout)
{
  timediff_t timeout_ms = Curl_timeleft(data, now, connect_timeout);
  if(timeout_ms < 0) {
    /* Handle timed out */
    struct curltime since;
    if(connect_timeout)
      since = data->progress.t_startsingle;
    else
      since = data->progress.t_startop;
    if(data->mstate == MSTATE_RESOLVING)
      failf(data, "Resolving timed out after %" FMT_TIMEDIFF_T
            " milliseconds", Curl_timediff(*now, since));
    else if(data->mstate == MSTATE_CONNECTING)
      failf(data, "Connection timed out after %" FMT_TIMEDIFF_T
            " milliseconds", Curl_timediff(*now, since));
    else {
      struct SingleRequest *k = &data->req;
      if(k->size != -1) {
        failf(data, "Operation timed out after %" FMT_TIMEDIFF_T
              " milliseconds with %" FMT_OFF_T " out of %"
              FMT_OFF_T " bytes received",
              Curl_timediff(*now, since), k->bytecount, k->size);
      }
      else {
        failf(data, "Operation timed out after %" FMT_TIMEDIFF_T
              " milliseconds with %" FMT_OFF_T " bytes received",
              Curl_timediff(*now, since), k->bytecount);
      }
    }
    *result = CURLE_OPERATION_TIMEDOUT;
    if(data->conn) {
      /* Force connection closed if the connection has indeed been used */
      if(data->mstate > MSTATE_DO) {
        streamclose(data->conn, "Disconnect due to timeout");
        *stream_error = TRUE;
      }
      (void)multi_done(data, *result, TRUE);
    }
    return TRUE;
  }

  return FALSE;
}